

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O0

bool re2::IsAnchorStart(Regexp **pre,int depth)

{
  undefined1 auVar1 [16];
  bool bVar2;
  RegexpOp RVar3;
  int iVar4;
  ParseFlags PVar5;
  ulong uVar6;
  Regexp **ppRVar7;
  Regexp **ppRVar8;
  Regexp *pRVar9;
  int local_3c;
  int i;
  Regexp **subcopy;
  Regexp *sub;
  Regexp *re;
  Regexp **ppRStack_18;
  int depth_local;
  Regexp **pre_local;
  
  sub = *pre;
  if ((sub != (Regexp *)0x0) && (depth < 4)) {
    re._4_4_ = depth;
    ppRStack_18 = pre;
    RVar3 = Regexp::op(sub);
    if (RVar3 == kRegexpConcat) {
      iVar4 = Regexp::nsub(sub);
      if (0 < iVar4) {
        ppRVar8 = Regexp::sub(sub);
        subcopy = (Regexp **)Regexp::Incref(*ppRVar8);
        bVar2 = IsAnchorStart((Regexp **)&subcopy,re._4_4_ + 1);
        if (bVar2) {
          iVar4 = Regexp::nsub(sub);
          auVar1._8_8_ = 0;
          auVar1._0_8_ = (long)iVar4;
          uVar6 = SUB168(auVar1 * ZEXT816(8),0);
          if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
            uVar6 = 0xffffffffffffffff;
          }
          ppRVar8 = (Regexp **)operator_new__(uVar6);
          *ppRVar8 = (Regexp *)subcopy;
          for (local_3c = 1; iVar4 = Regexp::nsub(sub), local_3c < iVar4; local_3c = local_3c + 1) {
            ppRVar7 = Regexp::sub(sub);
            pRVar9 = Regexp::Incref(ppRVar7[local_3c]);
            ppRVar8[local_3c] = pRVar9;
          }
          iVar4 = Regexp::nsub(sub);
          PVar5 = Regexp::parse_flags(sub);
          pRVar9 = Regexp::Concat(ppRVar8,iVar4,PVar5);
          *ppRStack_18 = pRVar9;
          if (ppRVar8 != (Regexp **)0x0) {
            operator_delete__(ppRVar8);
          }
          Regexp::Decref(sub);
          return true;
        }
        Regexp::Decref((Regexp *)subcopy);
      }
    }
    else if (RVar3 == kRegexpCapture) {
      ppRVar8 = Regexp::sub(sub);
      subcopy = (Regexp **)Regexp::Incref(*ppRVar8);
      bVar2 = IsAnchorStart((Regexp **)&subcopy,re._4_4_ + 1);
      ppRVar8 = subcopy;
      if (bVar2) {
        PVar5 = Regexp::parse_flags(sub);
        iVar4 = Regexp::cap(sub);
        pRVar9 = Regexp::Capture((Regexp *)ppRVar8,PVar5,iVar4);
        *ppRStack_18 = pRVar9;
        Regexp::Decref(sub);
        return true;
      }
      Regexp::Decref((Regexp *)subcopy);
    }
    else if (RVar3 == kRegexpBeginText) {
      PVar5 = Regexp::parse_flags(sub);
      pRVar9 = Regexp::LiteralString((Rune *)0x0,0,PVar5);
      *ppRStack_18 = pRVar9;
      Regexp::Decref(sub);
      return true;
    }
    return false;
  }
  return false;
}

Assistant:

static bool IsAnchorStart(Regexp** pre, int depth) {
  Regexp* re = *pre;
  Regexp* sub;
  // The depth limit makes sure that we don't overflow
  // the stack on a deeply nested regexp.  As the comment
  // above says, IsAnchorStart is conservative, so returning
  // a false negative is okay.  The exact limit is somewhat arbitrary.
  if (re == NULL || depth >= 4)
    return false;
  switch (re->op()) {
    default:
      break;
    case kRegexpConcat:
      if (re->nsub() > 0) {
        sub = re->sub()[0]->Incref();
        if (IsAnchorStart(&sub, depth+1)) {
          Regexp** subcopy = new Regexp*[re->nsub()];
          subcopy[0] = sub;  // already have reference
          for (int i = 1; i < re->nsub(); i++)
            subcopy[i] = re->sub()[i]->Incref();
          *pre = Regexp::Concat(subcopy, re->nsub(), re->parse_flags());
          delete[] subcopy;
          re->Decref();
          return true;
        }
        sub->Decref();
      }
      break;
    case kRegexpCapture:
      sub = re->sub()[0]->Incref();
      if (IsAnchorStart(&sub, depth+1)) {
        *pre = Regexp::Capture(sub, re->parse_flags(), re->cap());
        re->Decref();
        return true;
      }
      sub->Decref();
      break;
    case kRegexpBeginText:
      *pre = Regexp::LiteralString(NULL, 0, re->parse_flags());
      re->Decref();
      return true;
  }
  return false;
}